

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffercache.cpp
# Opt level: O2

void pbrt::InitBufferCaches(Allocator alloc)

{
  Allocator alloc_local;
  
  alloc_local = alloc;
  if (intBufferCache == (BufferCache<int> *)0x0) {
    intBufferCache =
         pstd::pmr::polymorphic_allocator<std::byte>::
         new_object<pbrt::BufferCache<int>,pstd::pmr::polymorphic_allocator<std::byte>&>
                   (&alloc_local,&alloc_local);
    point2BufferCache =
         pstd::pmr::polymorphic_allocator<std::byte>::
         new_object<pbrt::BufferCache<pbrt::Point2<float>>,pstd::pmr::polymorphic_allocator<std::byte>&>
                   (&alloc_local,&alloc_local);
    point3BufferCache =
         pstd::pmr::polymorphic_allocator<std::byte>::
         new_object<pbrt::BufferCache<pbrt::Point3<float>>,pstd::pmr::polymorphic_allocator<std::byte>&>
                   (&alloc_local,&alloc_local);
    vector3BufferCache =
         pstd::pmr::polymorphic_allocator<std::byte>::
         new_object<pbrt::BufferCache<pbrt::Vector3<float>>,pstd::pmr::polymorphic_allocator<std::byte>&>
                   (&alloc_local,&alloc_local);
    normal3BufferCache =
         pstd::pmr::polymorphic_allocator<std::byte>::
         new_object<pbrt::BufferCache<pbrt::Normal3<float>>,pstd::pmr::polymorphic_allocator<std::byte>&>
                   (&alloc_local,&alloc_local);
    return;
  }
  LogFatal<char_const(&)[26]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/buffercache.cpp"
             ,0x13,"Check failed: %s",(char (*) [26])"intBufferCache == nullptr");
}

Assistant:

void InitBufferCaches(Allocator alloc) {
    CHECK(intBufferCache == nullptr);
    intBufferCache = alloc.new_object<BufferCache<int>>(alloc);
    point2BufferCache = alloc.new_object<BufferCache<Point2f>>(alloc);
    point3BufferCache = alloc.new_object<BufferCache<Point3f>>(alloc);
    vector3BufferCache = alloc.new_object<BufferCache<Vector3f>>(alloc);
    normal3BufferCache = alloc.new_object<BufferCache<Normal3f>>(alloc);
}